

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void * memManager(VM *vm,void *ptr,uint32_t oldSize,uint32_t newSize)

{
  void *pvVar1;
  
  vm->allocatedBytes = vm->allocatedBytes + (newSize - oldSize);
  if (newSize != 0) {
    pvVar1 = realloc(ptr,(ulong)newSize);
    return pvVar1;
  }
  free(ptr);
  return (void *)0x0;
}

Assistant:

void *memManager(VM *vm, void *ptr, uint32_t oldSize, uint32_t newSize) {
    vm->allocatedBytes += newSize - oldSize;

    //避免realloc(NULL, 0)定义的新地址,此地址不能被释放
    if (newSize == 0) {
        free(ptr);
        return NULL;
    }

    return realloc(ptr, newSize);
}